

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O2

void color_theme_destroy(color_theme *theme)

{
  free(theme->unfocused);
  free(theme->focused);
  free(theme->urgent);
  free(theme->sticky);
  free(theme);
  return;
}

Assistant:

void color_theme_destroy(struct color_theme *theme)
{
        if (theme->unfocused != NULL) {
                color_value_destroy(theme->unfocused);
        }

        if (theme->focused != NULL) {
                color_value_destroy(theme->focused);
        }

        if (theme->urgent != NULL) {
                color_value_destroy(theme->urgent);
        }

        if (theme->sticky != NULL) {
                color_value_destroy(theme->sticky);
        }

        free(theme);
}